

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHexString.cpp
# Opt level: O0

void __thiscall PDFHexString::PDFHexString(PDFHexString *this,string *inValue)

{
  string *inValue_local;
  PDFHexString *this_local;
  
  PDFObject::PDFObject(&this->super_PDFObject,2);
  (this->super_PDFObject).super_RefCountObject._vptr_RefCountObject =
       (_func_int **)&PTR__PDFHexString_0054eff0;
  std::__cxx11::string::string((string *)&this->mValue);
  std::__cxx11::string::operator=((string *)&this->mValue,(string *)inValue);
  return;
}

Assistant:

PDFHexString::PDFHexString(const std::string& inValue):PDFObject(eType)
{
	mValue = inValue;
}